

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O0

void ddClearFlag2(DdNode *f)

{
  DdNode *f_local;
  
  if ((((ulong)f->next & 1) != 0) &&
     (f->next = (DdNode *)((ulong)f->next & 0xfffffffffffffffe), f->index != 0x7fffffff)) {
    ddClearFlag2((f->type).kids.T);
    ddClearFlag2((DdNode *)((ulong)(f->type).kids.E & 0xfffffffffffffffe));
  }
  return;
}

Assistant:

void
ddClearFlag2(
  DdNode * f)
{
    if (!Cudd_IsComplement(f->next)) {
    return;
    }
    /* Clear visited flag. */
    f->next = Cudd_Regular(f->next);
    if (cuddIsConstant(f)) {
    return;
    }
    ddClearFlag2(cuddT(f));
    ddClearFlag2(Cudd_Regular(cuddE(f)));
    return;

}